

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osgen3.c
# Opt level: O3

int os_get_event(unsigned_long timeout,int use_timeout,os_event_info_t *info)

{
  int iVar1;
  
  if (use_timeout != 0) {
    return 4;
  }
  iVar1 = os_getc();
  info->key[0] = iVar1;
  if (iVar1 == 0) {
    iVar1 = os_getc();
    info->key[1] = iVar1;
    if (iVar1 == 0x20) {
      return 5;
    }
  }
  return 1;
}

Assistant:

int os_get_event(unsigned long timeout, int use_timeout,
                 os_event_info_t *info)
{
    /* if there's a timeout, return an error indicating we don't allow it */
    if (use_timeout)
        return OS_EVT_NOTIMEOUT;

    /* get a key the normal way */
    info->key[0] = os_getc();

    /* if it's an extended key, get the other key */
    if (info->key[0] == 0)
    {
        /* get the extended key code */
        info->key[1] = os_getc();

        /* if it's EOF, return an EOF event rather than a key event */
        if (info->key[1] == CMD_EOF)
            return OS_EVT_EOF;
    }

    /* return the keyboard event */
    return OS_EVT_KEY;
}